

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O3

void __thiscall EOClient::Initialize(EOClient *this)

{
  uint uVar1;
  double dVar2;
  
  this->upload_fh = (FILE *)0x0;
  this->seq_start = 0;
  this->upcoming_seq_start = -1;
  this->seq = 0;
  uVar1 = World::GeneratePlayerID
                    ((World *)(this->super_Client).server[1].clients.
                              super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                              super__List_node_base._M_prev);
  this->id = uVar1;
  this->length = 0;
  this->packet_state = ReadLen1;
  this->state = Uninitialized;
  this->player = (Player *)0x0;
  this->version = 0;
  this->needpong = false;
  this->login_attempts = 0;
  dVar2 = Timer::GetTime();
  this->start = dVar2;
  return;
}

Assistant:

void EOClient::Initialize()
{
	this->upload_fh = 0;
	this->seq_start = 0;
	this->upcoming_seq_start = -1;
	this->seq = 0;
	this->id = this->server()->world->GeneratePlayerID();
	this->length = 0;
	this->packet_state = EOClient::ReadLen1;
	this->state = EOClient::Uninitialized;
	this->player = 0;
	this->version = 0;
	this->needpong = false;
	this->login_attempts = 0;
	this->start = Timer::GetTime();
}